

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O0

bool __thiscall
lambertian::scatter(lambertian *this,ray *r_in,hit_record *rec,vec3 *attenuation,ray *scattered,
                   double *pdf)

{
  element_type *peVar1;
  vec3 *u;
  double time;
  double dVar2;
  vec3 local_160;
  vec3 local_148;
  double local_130;
  double local_128;
  double local_120;
  ray local_118;
  vec3 local_e0;
  undefined1 local_c8 [8];
  vec3 scatter_direction;
  undefined1 local_98 [8];
  vec3 direction;
  onb uvw;
  double *pdf_local;
  ray *scattered_local;
  vec3 *attenuation_local;
  hit_record *rec_local;
  ray *r_in_local;
  lambertian *this_local;
  
  onb::onb((onb *)(direction.e + 2));
  onb::build_from_w((onb *)(direction.e + 2),&rec->normal);
  random_cosine_direction();
  onb::local((vec3 *)local_98,(onb *)(direction.e + 2),(vec3 *)(scatter_direction.e + 2));
  u = &rec->normal;
  random_unit_vector();
  operator+((vec3 *)local_c8,u,&local_e0);
  ray::time(r_in,(time_t *)u);
  ray::ray(&local_118,&rec->p,(vec3 *)local_c8,time);
  memcpy(scattered,&local_118,0x38);
  peVar1 = std::__shared_ptr_access<texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<texture,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->albedo);
  (**peVar1->_vptr_texture)(rec->u,rec->v,&local_130,peVar1,rec);
  attenuation->e[0] = local_130;
  attenuation->e[1] = local_128;
  attenuation->e[2] = local_120;
  onb::w(&local_148,(onb *)(direction.e + 2));
  ray::direction(&local_160,scattered);
  dVar2 = dot(&local_148,&local_160);
  *pdf = dVar2 / 3.141592653589793;
  return true;
}

Assistant:

virtual bool scatter(
            const ray& r_in, const hit_record& rec, vec3& attenuation, ray& scattered, double& pdf
    ) const {
        onb uvw;
        uvw.build_from_w(rec.normal);
        auto direction = uvw.local(random_cosine_direction());
        vec3 scatter_direction = rec.normal + random_unit_vector();
        scattered = ray(rec.p, scatter_direction, r_in.time());
        attenuation = albedo->value(rec.u, rec.v, rec.p);
        pdf = dot(uvw.w(), scattered.direction()) / pi;
        return true;
    }